

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::BasicTexImageCubeCase::createTexture(BasicTexImageCubeCase *this)

{
  deUint32 internalFormat;
  deUint32 format;
  deUint32 type;
  deUint32 dVar1;
  int width;
  char *str;
  void *data;
  PixelBufferAccess local_e8;
  PixelBufferAccess local_c0;
  undefined1 local_98 [8];
  Vec4 gMax;
  Vec4 gMin;
  int face;
  int levelSize;
  int ndx;
  undefined1 local_60 [8];
  Random rnd;
  undefined1 local_48 [8];
  TextureLevel levelData;
  deUint32 tex;
  BasicTexImageCubeCase *this_local;
  
  levelData.m_data.m_cap._4_4_ = 0;
  rnd.m_rnd._8_8_ = glu::mapGLTransferFormat(this->m_format,this->m_dataType);
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_48,(TextureFormat *)&rnd.m_rnd.z);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)local_60,dVar1);
  sglr::ContextWrapper::glGenTextures
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,1,
             (deUint32 *)((long)&levelData.m_data.m_cap + 4));
  sglr::ContextWrapper::glBindTexture
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0x8513,
             levelData.m_data.m_cap._4_4_);
  sglr::ContextWrapper::glPixelStorei
            (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,0xcf5,1);
  for (face = 0; face < (this->super_TextureCubeSpecCase).m_numLevels; face = face + 1) {
    width = de::max<int>(1,(this->super_TextureCubeSpecCase).m_size >> ((byte)face & 0x1f));
    tcu::TextureLevel::setSize((TextureLevel *)local_48,width,width,1);
    for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < 6;
        gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
      randomVector<4>((Functional *)(gMax.m_data + 2),(Random *)local_60,
                      &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                      &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
      randomVector<4>((Functional *)local_98,(Random *)local_60,
                      &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMin,
                      &(this->super_TextureCubeSpecCase).m_texFormatInfo.valueMax);
      tcu::TextureLevel::getAccess(&local_c0,(TextureLevel *)local_48);
      tcu::fillWithComponentGradients(&local_c0,(Vec4 *)(gMax.m_data + 2),(Vec4 *)local_98);
      dVar1 = *(deUint32 *)(s_cubeMapFaces + (long)(int)gMin.m_data[2] * 4);
      internalFormat = this->m_internalFormat;
      format = this->m_format;
      type = this->m_dataType;
      tcu::TextureLevel::getAccess(&local_e8,(TextureLevel *)local_48);
      data = tcu::PixelBufferAccess::getDataPtr(&local_e8);
      sglr::ContextWrapper::glTexImage2D
                (&(this->super_TextureCubeSpecCase).super_TextureSpecCase.super_ContextWrapper,dVar1
                 ,face,internalFormat,width,width,0,format,type,data);
    }
  }
  de::Random::~Random((Random *)local_60);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_48);
  return;
}

Assistant:

void createTexture (void)
	{
		deUint32			tex			= 0;
		tcu::TextureLevel	levelData	(glu::mapGLTransferFormat(m_format, m_dataType));
		de::Random			rnd			(deStringHash(getName()));

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int levelSize = de::max(1, m_size >> ndx);

			levelData.setSize(levelSize, levelSize);

			for (int face = 0; face < DE_LENGTH_OF_ARRAY(s_cubeMapFaces); face++)
			{
				Vec4 gMin = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);
				Vec4 gMax = randomVector<4>(rnd, m_texFormatInfo.valueMin, m_texFormatInfo.valueMax);

				tcu::fillWithComponentGradients(levelData.getAccess(), gMin, gMax);

				glTexImage2D(s_cubeMapFaces[face], ndx, m_internalFormat, levelSize, levelSize, 0, m_format, m_dataType, levelData.getAccess().getDataPtr());
			}
		}
	}